

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O3

void test_bson_iter_init_find_case(void)

{
  char cVar1;
  int iVar2;
  bson_t *pbVar3;
  char *pcVar4;
  ulong uVar5;
  bson_t *pbVar6;
  bson_t *pbVar7;
  bson_t *pbVar8;
  TestSuite *suite;
  undefined8 unaff_R14;
  bson_t *pbVar9;
  bson_iter_t iter;
  bson_t b;
  undefined1 auStack_1898 [4104];
  bson_t *pbStack_890;
  code *pcStack_888;
  undefined8 uStack_810;
  undefined1 uStack_808;
  TestSuite aTStack_800 [5];
  code *pcStack_708;
  int *piStack_690;
  int iStack_688;
  undefined1 auStack_684 [4];
  undefined1 auStack_680 [232];
  bson_t *pbStack_598;
  undefined1 *puStack_590;
  code *pcStack_588;
  bson_t bStack_580;
  bson_t abStack_500 [2];
  undefined8 uStack_3c8;
  char *pcStack_3c0;
  bson_t *pbStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  bson_t *pbStack_3a0;
  char *pcStack_398;
  code *pcStack_388;
  undefined1 auStack_380 [128];
  undefined1 auStack_300 [232];
  undefined1 *puStack_218;
  code *pcStack_208;
  undefined1 auStack_200 [128];
  undefined1 local_180 [368];
  
  pcStack_208 = (code *)0x12b7f0;
  bson_init(local_180);
  pcStack_208 = (code *)0x12b809;
  cVar1 = bson_append_int32(local_180,"FOO",0xffffffff,0x4d2);
  if (cVar1 == '\0') {
    pcStack_208 = (code *)0x12b850;
    test_bson_iter_init_find_case_cold_1();
LAB_0012b850:
    pcStack_208 = (code *)0x12b855;
    test_bson_iter_init_find_case_cold_2();
  }
  else {
    pcStack_208 = (code *)0x12b824;
    cVar1 = bson_iter_init_find_case(auStack_200,local_180,"foo");
    if (cVar1 == '\0') goto LAB_0012b850;
    pcStack_208 = (code *)0x12b830;
    iVar2 = bson_iter_int32(auStack_200);
    if (iVar2 == 0x4d2) {
      pcStack_208 = (code *)0x12b844;
      bson_destroy(local_180);
      return;
    }
  }
  pcStack_208 = test_bson_iter_find_descendant;
  test_bson_iter_init_find_case_cold_3();
  pcStack_388 = (code *)0x12b878;
  puStack_218 = local_180;
  pcStack_208 = (code *)&stack0xfffffffffffffff8;
  pbVar3 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/dotkey.bson"
                   );
  pcStack_388 = (code *)0x12b88b;
  cVar1 = bson_iter_init(auStack_300,pbVar3);
  if (cVar1 == '\0') {
    pcStack_388 = (code *)0x12bab0;
    test_bson_iter_find_descendant_cold_1();
LAB_0012bab0:
    pcStack_388 = (code *)0x12bab5;
    test_bson_iter_find_descendant_cold_2();
LAB_0012bab5:
    pcStack_388 = (code *)0x12baba;
    test_bson_iter_find_descendant_cold_3();
LAB_0012baba:
    pcStack_388 = (code *)0x12babf;
    test_bson_iter_find_descendant_cold_4();
LAB_0012babf:
    pcStack_388 = (code *)0x12bac4;
    test_bson_iter_find_descendant_cold_5();
LAB_0012bac4:
    pcStack_388 = (code *)0x12bac9;
    test_bson_iter_find_descendant_cold_6();
LAB_0012bac9:
    pcStack_388 = (code *)0x12bace;
    test_bson_iter_find_descendant_cold_7();
LAB_0012bace:
    pcStack_388 = (code *)0x12bad3;
    test_bson_iter_find_descendant_cold_8();
LAB_0012bad3:
    pcStack_388 = (code *)0x12bad8;
    test_bson_iter_find_descendant_cold_9();
LAB_0012bad8:
    pcStack_388 = (code *)0x12badd;
    test_bson_iter_find_descendant_cold_10();
LAB_0012badd:
    pcStack_388 = (code *)0x12bae2;
    test_bson_iter_find_descendant_cold_11();
LAB_0012bae2:
    pcStack_388 = (code *)0x12bae7;
    test_bson_iter_find_descendant_cold_12();
LAB_0012bae7:
    pcStack_388 = (code *)0x12baec;
    test_bson_iter_find_descendant_cold_13();
  }
  else {
    pcStack_388 = (code *)0x12b8aa;
    cVar1 = bson_iter_find_descendant(auStack_300,"a.b.c.0",auStack_380);
    if (cVar1 == '\0') goto LAB_0012bab0;
    pcStack_388 = (code *)0x12b8ba;
    iVar2 = bson_iter_type(auStack_380);
    if (iVar2 != 0x10) goto LAB_0012bab5;
    pcStack_388 = (code *)0x12b8cb;
    iVar2 = bson_iter_int32(auStack_380);
    if (iVar2 != 1) goto LAB_0012baba;
    pcStack_388 = (code *)0x12b8dc;
    bson_destroy(pbVar3);
    pcStack_388 = (code *)0x12b8e1;
    pbVar3 = (bson_t *)bson_bcon_magic();
    pcStack_388 = (code *)0x0;
    pcStack_398 = "]";
    pbStack_3a0 = (bson_t *)0x14ad57;
    uStack_3a8 = 1;
    uStack_3b0 = 0xf;
    pcStack_3c0 = "baz";
    uStack_3c8 = 0x12b930;
    pbStack_3b8 = pbVar3;
    unaff_R14 = bcon_new(0,"foo","{","bar","[","{");
    pcStack_388 = (code *)0x12b947;
    cVar1 = bson_iter_init(auStack_300,unaff_R14);
    if (cVar1 == '\0') goto LAB_0012babf;
    pcStack_388 = (code *)0x12b966;
    cVar1 = bson_iter_find_descendant(auStack_300,"foo.bar.0.baz",auStack_380);
    if (cVar1 == '\0') goto LAB_0012bac4;
    pcStack_388 = (code *)0x12b976;
    iVar2 = bson_iter_type(auStack_380);
    if (iVar2 != 0x10) goto LAB_0012bac9;
    pcStack_388 = (code *)0x12b987;
    iVar2 = bson_iter_int32(auStack_380);
    if (iVar2 != 1) goto LAB_0012bace;
    pcStack_388 = (code *)0x12b998;
    bson_destroy(unaff_R14);
    pcStack_388 = (code *)0x0;
    pcStack_398 = (char *)0xf;
    uStack_3a8 = 0x12b9c4;
    pbStack_3a0 = pbVar3;
    unaff_R14 = bcon_new(0,"nModified",pbVar3,0xf,1,"n");
    pcStack_388 = (code *)0x12b9db;
    cVar1 = bson_iter_init(auStack_300,unaff_R14);
    if (cVar1 == '\0') goto LAB_0012bad3;
    pcStack_388 = (code *)0x12b9fa;
    cVar1 = bson_iter_find_descendant(auStack_300,"n",auStack_380);
    if (cVar1 == '\0') goto LAB_0012bad8;
    pcStack_388 = (code *)0x12ba0a;
    pcVar4 = (char *)bson_iter_key(auStack_380);
    if ((*pcVar4 != 'n') || (pcVar4[1] != '\0')) goto LAB_0012badd;
    pcStack_388 = (code *)0x12ba25;
    bson_destroy(unaff_R14);
    pcStack_388 = (code *)0x0;
    pcStack_398 = (char *)0xf;
    uStack_3a8 = 0x12ba51;
    pbStack_3a0 = pbVar3;
    pbVar3 = (bson_t *)bcon_new(0,"",pbVar3,0xf,1,"n");
    pcStack_388 = (code *)0x12ba68;
    cVar1 = bson_iter_init(auStack_300,pbVar3);
    if (cVar1 == '\0') goto LAB_0012bae2;
    pcStack_388 = (code *)0x12ba83;
    cVar1 = bson_iter_find_descendant(auStack_300,"n",auStack_380);
    if (cVar1 == '\0') goto LAB_0012bae7;
    pcStack_388 = (code *)0x12ba8f;
    pcVar4 = (char *)bson_iter_key(auStack_380);
    if ((*pcVar4 == 'n') && (pcVar4[1] == '\0')) {
      pcStack_388 = (code *)0x12baa2;
      bson_destroy(pbVar3);
      return;
    }
  }
  pcStack_388 = test_bson_iter_as_bool;
  test_bson_iter_find_descendant_cold_14();
  pbVar7 = &bStack_580;
  pbVar8 = &bStack_580;
  pbVar9 = &bStack_580;
  pbVar6 = abStack_500;
  pcStack_588 = (code *)0x12bb15;
  pbStack_3a0 = pbVar3;
  pcStack_398 = (char *)unaff_R14;
  pcStack_388 = (code *)&pcStack_208;
  bson_init(pbVar6);
  pcStack_588 = (code *)0x12bb2e;
  bson_append_int32(pbVar6,"int32[true]",0xffffffff,1);
  pcStack_588 = (code *)0x12bb44;
  bson_append_int32(pbVar6,"int32[false]",0xffffffff,0);
  pcStack_588 = (code *)0x12bb60;
  bson_append_int64(pbVar6,"int64[true]",0xffffffff,1);
  pcStack_588 = (code *)0x12bb79;
  bson_append_int64(pbVar6,"int64[false]",0xffffffff,0);
  pcStack_588 = (code *)0x12bb91;
  bson_append_double(0x3ff0000000000000,pbVar6,"int64[true]",0xffffffff);
  pcStack_588 = (code *)0x12bba4;
  bson_append_double(0,pbVar6,"int64[false]",0xffffffff);
  pcStack_588 = (code *)0x12bbb2;
  bson_iter_init(&bStack_580,pbVar6);
  pcStack_588 = (code *)0x12bbba;
  bson_iter_next(&bStack_580);
  pcStack_588 = (code *)0x12bbc2;
  cVar1 = bson_iter_as_bool(&bStack_580);
  if (cVar1 == '\0') {
    pcStack_588 = (code *)0x12bc5a;
    test_bson_iter_as_bool_cold_1();
LAB_0012bc5a:
    pcStack_588 = (code *)0x12bc5f;
    test_bson_iter_as_bool_cold_6();
LAB_0012bc5f:
    pbVar7 = pbVar6;
    pcStack_588 = (code *)0x12bc64;
    test_bson_iter_as_bool_cold_2();
LAB_0012bc64:
    pcStack_588 = (code *)0x12bc69;
    test_bson_iter_as_bool_cold_5();
LAB_0012bc69:
    pbVar8 = pbVar7;
    pcStack_588 = (code *)0x12bc6e;
    test_bson_iter_as_bool_cold_3();
  }
  else {
    pcStack_588 = (code *)0x12bbd5;
    bson_iter_next(&bStack_580);
    pcStack_588 = (code *)0x12bbdd;
    cVar1 = bson_iter_as_bool(&bStack_580);
    pbVar6 = &bStack_580;
    if (cVar1 != '\0') goto LAB_0012bc5a;
    pcStack_588 = (code *)0x12bbec;
    bson_iter_next(&bStack_580);
    pcStack_588 = (code *)0x12bbf4;
    cVar1 = bson_iter_as_bool(&bStack_580);
    pbVar6 = &bStack_580;
    if (cVar1 == '\0') goto LAB_0012bc5f;
    pcStack_588 = (code *)0x12bc03;
    bson_iter_next(&bStack_580);
    pcStack_588 = (code *)0x12bc0b;
    cVar1 = bson_iter_as_bool(&bStack_580);
    if (cVar1 != '\0') goto LAB_0012bc64;
    pcStack_588 = (code *)0x12bc1a;
    bson_iter_next(&bStack_580);
    pcStack_588 = (code *)0x12bc22;
    cVar1 = bson_iter_as_bool(&bStack_580);
    pbVar7 = &bStack_580;
    if (cVar1 == '\0') goto LAB_0012bc69;
    pcStack_588 = (code *)0x12bc31;
    bson_iter_next(&bStack_580);
    pcStack_588 = (code *)0x12bc39;
    cVar1 = bson_iter_as_bool(&bStack_580);
    if (cVar1 == '\0') {
      pcStack_588 = (code *)0x12bc4a;
      bson_destroy(abStack_500);
      return;
    }
  }
  pcStack_588 = test_bson_iter_binary_deprecated;
  test_bson_iter_as_bool_cold_4();
  pcStack_708 = (code *)0x12bc91;
  pbStack_598 = pbVar8;
  puStack_590 = (undefined1 *)&bStack_580;
  pcStack_588 = (code *)&pcStack_388;
  pbVar3 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/binary_deprecated.bson"
                   );
  if (pbVar3 == (bson_t *)0x0) {
    pcStack_708 = (code *)0x12bd06;
    test_bson_iter_binary_deprecated_cold_5();
LAB_0012bd06:
    pcStack_708 = (code *)0x12bd0b;
    test_bson_iter_binary_deprecated_cold_1();
LAB_0012bd0b:
    pcStack_708 = (code *)0x12bd10;
    test_bson_iter_binary_deprecated_cold_2();
LAB_0012bd10:
    pcStack_708 = (code *)0x12bd15;
    test_bson_iter_binary_deprecated_cold_3();
  }
  else {
    pcStack_708 = (code *)0x12bca9;
    cVar1 = bson_iter_init(auStack_680,pbVar3);
    pbVar8 = pbVar3;
    if (cVar1 == '\0') goto LAB_0012bd06;
    pcStack_708 = (code *)0x12bcba;
    cVar1 = bson_iter_next(auStack_680);
    if (cVar1 == '\0') goto LAB_0012bd0b;
    pbVar9 = (bson_t *)&iStack_688;
    pcStack_708 = (code *)0x12bcdd;
    bson_iter_binary(auStack_680,auStack_684,pbVar9,&piStack_690);
    if (iStack_688 != 4) goto LAB_0012bd10;
    if (*piStack_690 == 0x34333231) {
      pcStack_708 = (code *)0x12bcf8;
      bson_destroy(pbVar3);
      return;
    }
  }
  pcStack_708 = test_bson_iter_from_data;
  test_bson_iter_binary_deprecated_cold_4();
  uStack_810 = 0x100620800000009;
  uStack_808 = 0;
  suite = aTStack_800;
  pcStack_888 = (code *)0x12bd51;
  pcStack_708 = (code *)&pcStack_588;
  cVar1 = bson_iter_init_from_data(suite,&uStack_810,9);
  if (cVar1 == '\0') {
    pcStack_888 = (code *)0x12bd93;
    test_bson_iter_from_data_cold_1();
LAB_0012bd93:
    pcStack_888 = (code *)0x12bd98;
    test_bson_iter_from_data_cold_2();
LAB_0012bd98:
    pcStack_888 = (code *)0x12bd9d;
    test_bson_iter_from_data_cold_3();
  }
  else {
    suite = aTStack_800;
    pcStack_888 = (code *)0x12bd62;
    cVar1 = bson_iter_next();
    if (cVar1 == '\0') goto LAB_0012bd93;
    suite = aTStack_800;
    pcStack_888 = (code *)0x12bd73;
    iVar2 = bson_iter_type();
    if (iVar2 != 8) goto LAB_0012bd98;
    suite = aTStack_800;
    pcStack_888 = (code *)0x12bd85;
    cVar1 = bson_iter_bool();
    if (cVar1 != '\0') {
      return;
    }
  }
  pcStack_888 = get_bson;
  test_bson_iter_from_data_cold_4();
  pbStack_890 = pbVar8;
  pcStack_888 = (code *)pbVar9;
  iVar2 = open((char *)suite,0);
  if (iVar2 != -1) {
    uVar5 = read(iVar2,auStack_1898,0x1000);
    if ((long)uVar5 < 0) goto LAB_0012be04;
    if (uVar5 != 0) {
      bson_new_from_data(auStack_1898,uVar5 & 0xffffffff);
      close(iVar2);
      return;
    }
    get_bson_cold_1();
  }
  get_bson_cold_3();
LAB_0012be04:
  get_bson_cold_2();
  TestSuite_Add(suite,"/bson/as_json/x1000",test_bson_as_json_x1000);
  TestSuite_Add(suite,"/bson/as_json/multi",test_bson_as_json_multi);
  TestSuite_Add(suite,"/bson/as_json/string",test_bson_as_json_string);
  TestSuite_Add(suite,"/bson/as_json/int32",test_bson_as_json_int32);
  TestSuite_Add(suite,"/bson/as_json/int64",test_bson_as_json_int64);
  TestSuite_Add(suite,"/bson/as_json/double",test_bson_as_json_double);
  TestSuite_Add(suite,"/bson/as_json/double/nonfinite",test_bson_as_json_double_nonfinite);
  TestSuite_Add(suite,"/bson/as_json/code",test_bson_as_json_code);
  TestSuite_Add(suite,"/bson/as_json/date_time",test_bson_as_json_date_time);
  TestSuite_Add(suite,"/bson/as_json/regex",test_bson_as_json_regex);
  TestSuite_Add(suite,"/bson/as_json/symbol",test_bson_as_json_symbol);
  TestSuite_Add(suite,"/bson/as_json/utf8",test_bson_as_json_utf8);
  TestSuite_Add(suite,"/bson/as_json/dbpointer",test_bson_as_json_dbpointer);
  TestSuite_Add(suite,"/bson/as_canonical_extended_json/dbpointer",
                test_bson_as_canonical_extended_json_dbpointer);
  TestSuite_Add(suite,"/bson/as_json/stack_overflow",test_bson_as_json_stack_overflow);
  TestSuite_Add(suite,"/bson/as_json/corrupt",test_bson_corrupt);
  TestSuite_Add(suite,"/bson/as_json/corrupt_utf8",test_bson_corrupt_utf8);
  TestSuite_Add(suite,"/bson/as_json/corrupt_binary",test_bson_corrupt_binary);
  TestSuite_Add(suite,"/bson/as_json_spacing",test_bson_as_json_spacing);
  TestSuite_Add(suite,"/bson/array_as_json",test_bson_array_as_json);
  TestSuite_Add(suite,"/bson/json/allow_multiple",test_bson_json_allow_multiple);
  TestSuite_Add(suite,"/bson/json/read/buffering",test_bson_json_read_buffering);
  TestSuite_Add(suite,"/bson/json/read",test_bson_json_read);
  TestSuite_Add(suite,"/bson/json/inc",test_bson_json_inc);
  TestSuite_Add(suite,"/bson/json/array",test_bson_json_array);
  TestSuite_Add(suite,"/bson/json/array/single",test_bson_json_array_single);
  TestSuite_Add(suite,"/bson/json/array/int64",test_bson_json_array_int64);
  TestSuite_Add(suite,"/bson/json/array/subdoc",test_bson_json_array_subdoc);
  TestSuite_Add(suite,"/bson/json/date",test_bson_json_date);
  TestSuite_Add(suite,"/bson/json/date/legacy",test_bson_json_date_legacy);
  TestSuite_Add(suite,"/bson/json/date/long",test_bson_json_date_numberlong);
  TestSuite_Add(suite,"/bson/json/timestamp",test_bson_json_timestamp);
  TestSuite_Add(suite,"/bson/json/read/empty",test_bson_json_read_empty);
  TestSuite_Add(suite,"/bson/json/read/missing_complex",test_bson_json_read_missing_complex);
  TestSuite_Add(suite,"/bson/json/read/invalid_binary",test_bson_json_read_invalid_binary);
  TestSuite_Add(suite,"/bson/json/read/invalid_json",test_bson_json_read_invalid_json);
  TestSuite_Add(suite,"/bson/json/read/bad_cb",test_bson_json_read_bad_cb);
  TestSuite_Add(suite,"/bson/json/read/invalid",test_bson_json_read_invalid);
  TestSuite_Add(suite,"/bson/json/read/raw_utf8",test_bson_json_read_raw_utf8);
  TestSuite_Add(suite,"/bson/json/read/corrupt_utf8",test_bson_json_read_corrupt_utf8);
  TestSuite_Add(suite,"/bson/json/read/decimal128",test_bson_json_read_decimal128);
  TestSuite_Add(suite,"/bson/json/read/dbpointer",test_bson_json_read_dbpointer);
  TestSuite_Add(suite,"/bson/json/read/legacy_regex",test_bson_json_read_legacy_regex);
  TestSuite_Add(suite,"/bson/json/read/regex_options_order",test_bson_json_read_regex_options_order)
  ;
  TestSuite_Add(suite,"/bson/json/read/binary",test_bson_json_read_binary);
  TestSuite_Add(suite,"/bson/json/read/legacy_binary",test_bson_json_read_legacy_binary);
  TestSuite_Add(suite,"/bson/json/read/file",test_json_reader_new_from_file);
  TestSuite_Add(suite,"/bson/json/read/bad_path",test_json_reader_new_from_bad_path);
  TestSuite_Add(suite,"/bson/json/read/$numberLong",test_bson_json_number_long);
  TestSuite_Add(suite,"/bson/json/read/$numberLong/zero",test_bson_json_number_long_zero);
  TestSuite_Add(suite,"/bson/json/read/code",test_bson_json_code);
  TestSuite_Add(suite,"/bson/json/read/code/errors",test_bson_json_code_errors);
  TestSuite_Add(suite,"/bson/json/read/dbref",test_bson_json_dbref);
  TestSuite_Add(suite,"/bson/json/read/uescape",test_bson_json_uescape);
  TestSuite_Add(suite,"/bson/json/read/uescape/key",test_bson_json_uescape_key);
  TestSuite_Add(suite,"/bson/json/read/uescape/bad",test_bson_json_uescape_bad);
  TestSuite_Add(suite,"/bson/json/read/int32",test_bson_json_int32);
  TestSuite_Add(suite,"/bson/json/read/int64",test_bson_json_int64);
  TestSuite_Add(suite,"/bson/json/read/double",test_bson_json_double);
  TestSuite_Add(suite,"/bson/json/read/double/overflow",test_bson_json_double_overflow);
  TestSuite_Add(suite,"/bson/json/read/double/nan",test_bson_json_nan);
  TestSuite_Add(suite,"/bson/json/read/double/infinity",test_bson_json_infinity);
  TestSuite_Add(suite,"/bson/json/read/null",test_bson_json_null);
  TestSuite_Add(suite,"/bson/json/read/empty_final",test_bson_json_empty_final_object);
  TestSuite_Add(suite,"/bson/as_json/decimal128",test_bson_as_json_decimal128);
  TestSuite_Add(suite,"/bson/json/read/$numberDecimal",test_bson_json_number_decimal);
  TestSuite_Add(suite,"/bson/json/errors",test_bson_json_errors);
  TestSuite_Add(suite,"/bson/integer/width",test_bson_integer_width);
  TestSuite_Add(suite,"/bson/json/read/null_in_str",test_bson_json_null_in_str);
  TestSuite_Add(suite,"/bson/as_json/multi_object",test_bson_as_json_multi_object);
  return;
}

Assistant:

static void
test_bson_iter_init_find_case (void)
{
   bson_t b;
   bson_iter_t iter;

   bson_init (&b);
   BSON_ASSERT (bson_append_int32 (&b, "FOO", -1, 1234));
   BSON_ASSERT (bson_iter_init_find_case (&iter, &b, "foo"));
   BSON_ASSERT_CMPINT (bson_iter_int32 (&iter), ==, 1234);
   bson_destroy (&b);
}